

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

int __thiscall ev3dev::device::connect(device *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  size_t __n;
  bool bVar1;
  bool bVar2;
  int iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  const_iterator cVar5;
  _Rb_tree_node_base *p_Var6;
  undefined4 in_register_0000000c;
  long lVar7;
  int iVar8;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string strValue;
  long lVar9;
  
  lVar7 = CONCAT44(in_register_0000000c,__len);
  __n = *(size_t *)(__addr->sa_data + 6);
  __dirp = opendir((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_register_00000034,__fd))->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    iVar8 = 0;
  }
  else {
    lVar9 = lVar7;
    while( true ) {
      pdVar4 = readdir(__dirp);
      lVar9 = CONCAT71((int7)((ulong)lVar9 >> 8),pdVar4 != (dirent *)0x0);
      iVar8 = (int)lVar9;
      if (pdVar4 == (dirent *)0x0) break;
      iVar3 = strncmp(pdVar4->d_name,*(char **)__addr,__n);
      if (iVar3 == 0) {
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_register_00000034,__fd),pdVar4->d_name);
        std::operator+(&strValue,&local_70,'/');
        std::__cxx11::string::operator=((string *)this,(string *)&strValue);
        std::__cxx11::string::~string((string *)&strValue);
        std::__cxx11::string::~string((string *)&local_70);
        bVar2 = true;
        for (p_Var6 = *(_Rb_tree_node_base **)(lVar7 + 0x18);
            p_Var6 != (_Rb_tree_node_base *)(lVar7 + 8);
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          get_attr_string(&strValue,this,(string *)(p_Var6 + 1));
          if ((p_Var6[3]._M_parent == (_Base_ptr)0x0) ||
             (p_Var6[2]._M_right[1]._M_parent == (_Base_ptr)0x0)) {
LAB_00160bd5:
            bVar1 = true;
          }
          else {
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(p_Var6 + 2),&strValue);
            if (cVar5._M_node != (_Base_ptr)&p_Var6[2]._M_parent) goto LAB_00160bd5;
            bVar2 = false;
            bVar1 = false;
          }
          std::__cxx11::string::~string((string *)&strValue);
          if (!bVar1) break;
        }
        if (bVar2) break;
        (this->_path)._M_string_length = 0;
        *(this->_path)._M_dataplus._M_p = '\0';
      }
    }
    closedir(__dirp);
  }
  return iVar8;
}

Assistant:

bool device::connect(
        const std::string &dir,
        const std::string &pattern,
        const std::map<std::string, std::set<std::string>> &match
        ) noexcept
{
    using namespace std;

    const size_t pattern_length = pattern.length();

    struct dirent *dp;
    DIR *dfd;

    if ((dfd = opendir(dir.c_str())) != nullptr) {
        while ((dp = readdir(dfd)) != nullptr) {
            if (strncmp(dp->d_name, pattern.c_str(), pattern_length)==0) {
                try {
                    _path = dir + dp->d_name + '/';

                    bool bMatch = true;
                    for (auto &m : match) {
                        const auto &attribute = m.first;
                        const auto &matches   = m.second;
                        const auto strValue   = get_attr_string(attribute);

                        if (!matches.empty() && !matches.begin()->empty() &&
                                (matches.find(strValue) == matches.end()))
                        {
                            bMatch = false;
                            break;
                        }
                    }

                    if (bMatch) {
                        closedir(dfd);
                        return true;
                    }
                } catch (...) { }

                _path.clear();
            }
        }

        closedir(dfd);
    }

    return false;
}